

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_readonly(sqlite3 *db,char *zDbName)

{
  Btree *p;
  sqlite3 *in_RSI;
  Btree *pBt;
  int local_1c;
  
  p = sqlite3DbNameToBtree(in_RSI,&DAT_aaaaaaaaaaaaaaaa);
  if (p == (Btree *)0x0) {
    local_1c = -1;
  }
  else {
    local_1c = sqlite3BtreeIsReadonly(p);
  }
  return local_1c;
}

Assistant:

SQLITE_API int sqlite3_db_readonly(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeIsReadonly(pBt) : -1;
}